

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariables.cpp
# Opt level: O3

ChVariables * __thiscall chrono::ChVariables::operator=(ChVariables *this,ChVariables *other)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index index;
  ulong uVar13;
  long lVar14;
  ActualDstType actualDst;
  Index size;
  
  if (other != this) {
    this->disabled = other->disabled;
    pdVar3 = (other->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar4 = (other->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != uVar4) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar4,1)
      ;
      if ((this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar4) goto LAB_007dd53f;
    }
    pdVar5 = (this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar13 = uVar4 + 7;
    if (-1 < (long)uVar4) {
      uVar13 = uVar4;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar4) {
      lVar14 = 0;
      do {
        pdVar2 = pdVar3 + lVar14;
        dVar6 = pdVar2[1];
        dVar7 = pdVar2[2];
        dVar8 = pdVar2[3];
        dVar9 = pdVar2[4];
        dVar10 = pdVar2[5];
        dVar11 = pdVar2[6];
        dVar12 = pdVar2[7];
        pdVar1 = pdVar5 + lVar14;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar6;
        pdVar1[2] = dVar7;
        pdVar1[3] = dVar8;
        pdVar1[4] = dVar9;
        pdVar1[5] = dVar10;
        pdVar1[6] = dVar11;
        pdVar1[7] = dVar12;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar4) {
      do {
        pdVar5[uVar13] = pdVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
    pdVar3 = (other->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar4 = (other->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if ((this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        != uVar4) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&(this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar4,1)
      ;
      if ((this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar4) {
LAB_007dd53f:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                     );
      }
    }
    pdVar5 = (this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar13 = uVar4 + 7;
    if (-1 < (long)uVar4) {
      uVar13 = uVar4;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar4) {
      lVar14 = 0;
      do {
        pdVar2 = pdVar3 + lVar14;
        dVar6 = pdVar2[1];
        dVar7 = pdVar2[2];
        dVar8 = pdVar2[3];
        dVar9 = pdVar2[4];
        dVar10 = pdVar2[5];
        dVar11 = pdVar2[6];
        dVar12 = pdVar2[7];
        pdVar1 = pdVar5 + lVar14;
        *pdVar1 = *pdVar2;
        pdVar1[1] = dVar6;
        pdVar1[2] = dVar7;
        pdVar1[3] = dVar8;
        pdVar1[4] = dVar9;
        pdVar1[5] = dVar10;
        pdVar1[6] = dVar11;
        pdVar1[7] = dVar12;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar4) {
      do {
        pdVar5[uVar13] = pdVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
    this->ndof = other->ndof;
    this->offset = other->offset;
  }
  return this;
}

Assistant:

ChVariables& ChVariables::operator=(const ChVariables& other) {
    if (&other == this)
        return *this;

    this->disabled = other.disabled;

    this->qb = other.qb;
    this->fb = other.fb;

    this->ndof = other.ndof;
    this->offset = other.offset;

    return *this;
}